

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O1

void helicsTranslatorSetTag(HelicsTranslator trans,char *tagname,char *tagvalue,HelicsError *err)

{
  Interface *this;
  HelicsTranslator pvVar1;
  size_t sVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  bool bVar6;
  string_view tag;
  string_view value;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (trans == (HelicsTranslator)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001b40ea;
    }
    else {
      bVar6 = *(int *)((long)trans + 4) == -0x4c83cad2;
      pvVar1 = (HelicsTranslator)0x0;
      if (bVar6) {
        pvVar1 = trans;
      }
      if (bVar6 || err == (HelicsError *)0x0) goto LAB_001b40ec;
    }
    err->error_code = -3;
    err->message = "The given translator object is not valid";
  }
LAB_001b40ea:
  pvVar1 = (HelicsTranslator)0x0;
LAB_001b40ec:
  if (pvVar1 != (HelicsTranslator)0x0) {
    this = *(Interface **)((long)pvVar1 + 8);
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (tagname != (char *)0x0) {
      sVar2 = strlen(tagname);
      _Var5._M_p = tagname;
    }
    sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var4._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (tagvalue != (char *)0x0) {
      sVar3 = strlen(tagvalue);
      _Var4._M_p = tagvalue;
    }
    tag._M_str = _Var5._M_p;
    tag._M_len = sVar2;
    value._M_str = _Var4._M_p;
    value._M_len = sVar3;
    helics::Interface::setTag(this,tag,value);
  }
  return;
}

Assistant:

void helicsTranslatorSetTag(HelicsTranslator trans, const char* tagname, const char* tagvalue, HelicsError* err)
{
    auto* transObj = getTranslatorObj(trans, err);
    if (transObj == nullptr) {
        return;
    }
    try {
        transObj->transPtr->setTag(AS_STRING_VIEW(tagname), AS_STRING_VIEW(tagvalue));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}